

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * gravity_parser_run(gravity_parser_t *parser,gravity_delegate_t *delegate)

{
  gravity_lexer_t *pgVar1;
  gravity_delegate_t *pgVar2;
  double dVar3;
  gtoken_t gVar4;
  char *pcVar5;
  size_t len;
  gravity_lexer_t *pgVar6;
  gravity_lexer_t **ppgVar7;
  char **ppcVar8;
  gnode_r *pgVar9;
  gnode_t *pgVar10;
  gnode_t **ppgVar11;
  nanotime_t tstart;
  lexer_r *plVar12;
  nanotime_t tend;
  size_t sVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  
  parser->delegate = delegate;
  gravity_lexer_setdelegate(parser->lexer->p[parser->lexer->n - 1],delegate);
  if ((((delegate != (gravity_delegate_t *)0x0) &&
       (delegate->precode_callback != (gravity_precode_callback)0x0)) &&
      (pcVar5 = (*delegate->precode_callback)(delegate->xdata), pcVar5 != (char *)0x0)) &&
     ((len = strlen(pcVar5), len != 0 &&
      (pgVar6 = gravity_lexer_create(pcVar5,len,0,true), pgVar6 != (gravity_lexer_t *)0x0)))) {
    plVar12 = parser->lexer;
    sVar15 = plVar12->n;
    ppgVar7 = plVar12->p;
    sVar13 = sVar15 - 1;
    plVar12->n = sVar13;
    pgVar1 = ppgVar7[sVar15 - 1];
    if (sVar13 == plVar12->m) {
      sVar15 = 8;
      if (sVar13 != 0) {
        sVar15 = sVar13 * 2;
      }
      plVar12->m = sVar15;
      ppgVar7 = (gravity_lexer_t **)realloc(ppgVar7,sVar15 << 3);
      plVar12 = parser->lexer;
      plVar12->p = ppgVar7;
      sVar13 = plVar12->n;
    }
    plVar12->n = sVar13 + 1;
    ppgVar7[sVar13] = pgVar6;
    plVar12 = parser->lexer;
    sVar13 = plVar12->n;
    if (sVar13 == plVar12->m) {
      sVar15 = 8;
      if (sVar13 != 0) {
        sVar15 = sVar13 * 2;
      }
      plVar12->m = sVar15;
      ppgVar7 = (gravity_lexer_t **)realloc(plVar12->p,sVar15 << 3);
      plVar12 = parser->lexer;
      plVar12->p = ppgVar7;
      sVar13 = plVar12->n;
    }
    else {
      ppgVar7 = plVar12->p;
    }
    plVar12->n = sVar13 + 1;
    ppgVar7[sVar13] = pgVar1;
  }
  ppcVar8 = gravity_core_identifiers();
  pgVar9 = gnode_array_create();
  pcVar5 = *ppcVar8;
  if (pcVar5 != (char *)0x0) {
    uVar14 = 1;
    do {
      pcVar5 = string_dup(pcVar5);
      sVar13 = parser->declarations->n;
      if (sVar13 == 0) {
        pgVar10 = (gnode_t *)0x0;
      }
      else {
        pgVar10 = parser->declarations->p[sVar13 - 1];
      }
      pgVar10 = gnode_variable_create
                          ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar5,(char *)0x0,(gnode_t *)0x0,pgVar10,
                           (gnode_variable_decl_t *)0x0);
      sVar13 = pgVar9->n;
      ppgVar11 = pgVar9->p;
      if (sVar13 == pgVar9->m) {
        sVar15 = sVar13 * 2;
        if (sVar13 == 0) {
          sVar15 = 8;
        }
        pgVar9->m = sVar15;
        ppgVar11 = (gnode_t **)realloc(ppgVar11,sVar15 << 3);
        pgVar9->p = ppgVar11;
        sVar13 = pgVar9->n;
      }
      pgVar9->n = sVar13 + 1;
      ppgVar11[sVar13] = pgVar10;
      pcVar5 = ppcVar8[uVar14];
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (pcVar5 != (char *)0x0);
  }
  sVar13 = parser->declarations->n;
  if (sVar13 == 0) {
    pgVar10 = (gnode_t *)0x0;
  }
  else {
    pgVar10 = parser->declarations->p[sVar13 - 1];
  }
  pgVar10 = gnode_variable_decl_create
                      ((gtoken_s)ZEXT1640(ZEXT816(0)),TOK_KEY_VAR,TOK_EOF,TOK_KEY_EXTERN,pgVar9,
                       pgVar10);
  pgVar9 = parser->statements;
  sVar13 = pgVar9->n;
  if (sVar13 == pgVar9->m) {
    sVar15 = 8;
    if (sVar13 != 0) {
      sVar15 = sVar13 * 2;
    }
    pgVar9->m = sVar15;
    ppgVar11 = (gnode_t **)realloc(pgVar9->p,sVar15 << 3);
    pgVar9 = parser->statements;
    pgVar9->p = ppgVar11;
    sVar13 = pgVar9->n;
  }
  else {
    ppgVar11 = pgVar9->p;
  }
  pgVar9->n = sVar13 + 1;
  ppgVar11[sVar13] = pgVar10;
  pcVar5 = "Math";
  lVar16 = 0;
  pgVar9 = gnode_array_create();
  do {
    pcVar5 = string_dup(pcVar5);
    sVar13 = parser->declarations->n;
    if (sVar13 == 0) {
      pgVar10 = (gnode_t *)0x0;
    }
    else {
      pgVar10 = parser->declarations->p[sVar13 - 1];
    }
    pgVar10 = gnode_variable_create
                        ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar5,(char *)0x0,(gnode_t *)0x0,pgVar10,
                         (gnode_variable_decl_t *)0x0);
    sVar13 = pgVar9->n;
    ppgVar11 = pgVar9->p;
    if (sVar13 == pgVar9->m) {
      sVar15 = sVar13 * 2;
      if (sVar13 == 0) {
        sVar15 = 8;
      }
      pgVar9->m = sVar15;
      ppgVar11 = (gnode_t **)realloc(ppgVar11,sVar15 << 3);
      pgVar9->p = ppgVar11;
      sVar13 = pgVar9->n;
    }
    pgVar9->n = sVar13 + 1;
    ppgVar11[sVar13] = pgVar10;
    pcVar5 = *(char **)(gravity_optional_identifiers_list + lVar16 * 8 + 8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  pgVar2 = parser->delegate;
  if ((pgVar2 != (gravity_delegate_t *)0x0) &&
     (pgVar2->optional_classes != (gravity_optclass_callback)0x0)) {
    ppcVar8 = (*pgVar2->optional_classes)(pgVar2->xdata);
    pcVar5 = *ppcVar8;
    if (pcVar5 != (char *)0x0) {
      uVar14 = 1;
      do {
        pcVar5 = string_dup(pcVar5);
        sVar13 = parser->declarations->n;
        if (sVar13 == 0) {
          pgVar10 = (gnode_t *)0x0;
        }
        else {
          pgVar10 = parser->declarations->p[sVar13 - 1];
        }
        pgVar10 = gnode_variable_create
                            ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar5,(char *)0x0,(gnode_t *)0x0,
                             pgVar10,(gnode_variable_decl_t *)0x0);
        sVar13 = pgVar9->n;
        ppgVar11 = pgVar9->p;
        if (sVar13 == pgVar9->m) {
          sVar15 = sVar13 * 2;
          if (sVar13 == 0) {
            sVar15 = 8;
          }
          pgVar9->m = sVar15;
          ppgVar11 = (gnode_t **)realloc(ppgVar11,sVar15 << 3);
          pgVar9->p = ppgVar11;
          sVar13 = pgVar9->n;
        }
        pgVar9->n = sVar13 + 1;
        ppgVar11[sVar13] = pgVar10;
        pcVar5 = ppcVar8[uVar14];
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (pcVar5 != (char *)0x0);
    }
  }
  sVar13 = parser->declarations->n;
  if (sVar13 == 0) {
    pgVar10 = (gnode_t *)0x0;
  }
  else {
    pgVar10 = parser->declarations->p[sVar13 - 1];
  }
  pgVar10 = gnode_variable_decl_create
                      ((gtoken_s)ZEXT1640(ZEXT816(0)),TOK_KEY_VAR,TOK_EOF,TOK_KEY_EXTERN,pgVar9,
                       pgVar10);
  pgVar9 = parser->statements;
  sVar13 = pgVar9->n;
  if (sVar13 == pgVar9->m) {
    sVar15 = 8;
    if (sVar13 != 0) {
      sVar15 = sVar13 * 2;
    }
    pgVar9->m = sVar15;
    ppgVar11 = (gnode_t **)realloc(pgVar9->p,sVar15 << 3);
    pgVar9 = parser->statements;
    pgVar9->p = ppgVar11;
    sVar13 = pgVar9->n;
  }
  else {
    ppgVar11 = pgVar9->p;
  }
  pgVar9->n = sVar13 + 1;
  ppgVar11[sVar13] = pgVar10;
  tstart = nanotime();
  plVar12 = parser->lexer;
  sVar13 = plVar12->n;
  do {
    while (gVar4 = gravity_lexer_peek(plVar12->p[sVar13 - 1]), gVar4 != TOK_EOF) {
      pgVar10 = parse_statement(parser);
      if (pgVar10 != (gnode_t *)0x0) {
        pgVar9 = parser->statements;
        sVar13 = pgVar9->n;
        if (sVar13 == pgVar9->m) {
          sVar15 = sVar13 * 2;
          if (sVar13 == 0) {
            sVar15 = 8;
          }
          pgVar9->m = sVar15;
          ppgVar11 = (gnode_t **)realloc(pgVar9->p,sVar15 << 3);
          pgVar9 = parser->statements;
          pgVar9->p = ppgVar11;
          sVar13 = pgVar9->n;
        }
        else {
          ppgVar11 = pgVar9->p;
        }
        pgVar9->n = sVar13 + 1;
        ppgVar11[sVar13] = pgVar10;
      }
      plVar12 = parser->lexer;
      sVar13 = plVar12->n;
    }
    gravity_lexer_free(parser->lexer->p[parser->lexer->n - 1]);
    plVar12 = parser->lexer;
    sVar13 = plVar12->n - 1;
    plVar12->n = sVar13;
  } while (sVar13 != 0);
  tend = nanotime();
  dVar3 = millitime(tstart,tend);
  parser->time = dVar3;
  pgVar9 = parser->declarations;
  if (parser->nerrors == 0) {
    if (pgVar9->n == 0) {
      pgVar10 = gnode_block_stat_create
                          (NODE_LIST_STAT,(gtoken_s)ZEXT1640(ZEXT816(0)),parser->statements,
                           (gnode_t *)0x0,0);
      return pgVar10;
    }
  }
  else {
    if (pgVar9->n == 0) {
      pgVar10 = (gnode_t *)0x0;
    }
    else {
      pgVar10 = pgVar9->p[pgVar9->n - 1];
    }
    pgVar10 = gnode_block_stat_create
                        (NODE_LIST_STAT,(gtoken_s)ZEXT1640(ZEXT816(0)),parser->statements,pgVar10,0)
    ;
    gnode_free(pgVar10);
  }
  return (gnode_t *)0x0;
}

Assistant:

gnode_t *gravity_parser_run (gravity_parser_t *parser, gravity_delegate_t *delegate) {
    parser->delegate = delegate;
    gravity_lexer_setdelegate(CURRENT_LEXER, delegate);

    // check if some user code needs to be prepended
    if ((delegate) && (delegate->precode_callback))
        parser_appendcode(delegate->precode_callback(delegate->xdata), parser);

    // if there are syntax errors then just returns
    if (parser_run(parser) > 0) {
        parser_cleanup (parser);
        return NULL;
    }

    // if there are some open declarations then there should be an error somewhere
    if (marray_size(*parser->declarations) > 0) return NULL;

    // return ast
    return gnode_block_stat_create(NODE_LIST_STAT, NO_TOKEN, parser->statements, NULL, 0);
}